

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O2

int32_t ucol_swapInverseUCA_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  int32_t *__src;
  int32_t iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  void *__dest;
  byte bVar7;
  
  iVar1 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar7 = *(byte *)((long)inData + 0xd);
    if ((((bVar7 == 0x6e && *(byte *)((long)inData + 0xc) == 0x49) &&
         (bVar7 = 0x6e, *(char *)((long)inData + 0xe) == 'v')) &&
        (*(char *)((long)inData + 0xf) == 'C')) &&
       ((*(char *)((long)inData + 0x10) == '\x02' && (*(char *)((long)inData + 0x11) != '\0')))) {
      __src = (int32_t *)((long)inData + (long)iVar1);
      if (length < 0) {
        uVar2 = udata_readInt32_63(ds,*__src);
      }
      else {
        if ((length - iVar1 < 0x20) ||
           (uVar2 = udata_readInt32_63(ds,*__src), (uint)(length - iVar1) < uVar2)) {
          udata_printError_63(ds,
                              "ucol_swapInverseUCA(): too few bytes (%d after header) for inverse UCA collation data\n"
                              ,(ulong)(uint)length);
          *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        __dest = (void *)((long)iVar1 + (long)outData);
        if (inData != outData) {
          memcpy(__dest,__src,(ulong)uVar2);
        }
        uVar3 = (*ds->readUInt32)(__src[1]);
        uVar4 = (*ds->readUInt32)(__src[2]);
        uVar5 = (*ds->readUInt32)(__src[3]);
        uVar6 = (*ds->readUInt32)(__src[4]);
        (*ds->swapArray32)(ds,__src,0x14,__dest,pErrorCode);
        (*ds->swapArray32)(ds,(void *)((ulong)uVar5 + (long)__src),uVar3 * 0xc,
                           (void *)((ulong)uVar5 + (long)__dest),pErrorCode);
        (*ds->swapArray16)(ds,(void *)((long)__src + (ulong)uVar6),uVar4 * 2,
                           (void *)((long)__dest + (ulong)uVar6),pErrorCode);
      }
      return uVar2 + iVar1;
    }
    udata_printError_63(ds,
                        "ucol_swapInverseUCA(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not an inverse UCA collation file\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar7,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (ulong)*(byte *)((long)inData + 0x10),(ulong)*(byte *)((long)inData + 0x11))
    ;
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_swapInverseUCA(const UDataSwapper *ds,
                    const void *inData, int32_t length, void *outData,
                    UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const InverseUCATableHeader *inHeader;
    InverseUCATableHeader *outHeader;
    InverseUCATableHeader header={ 0,0,0,0,0,{0,0,0,0},{0,0,0,0,0,0,0,0} };

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x49 &&   /* dataFormat="InvC" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x76 &&
        pInfo->dataFormat[3]==0x43 &&
        pInfo->formatVersion[0]==2 &&
        pInfo->formatVersion[1]>=1
    )) {
        udata_printError(ds, "ucol_swapInverseUCA(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not an inverse UCA collation file\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0], pInfo->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inHeader=(const InverseUCATableHeader *)inBytes;
    outHeader=(InverseUCATableHeader *)outBytes;

    /*
     * The inverse UCA collation binary must contain at least the InverseUCATableHeader,
     * starting with its size field.
     * sizeof(UCATableHeader)==8*4 in ICU 2.8
     * check the length against the header size before reading the size field
     */
    if(length<0) {
        header.byteSize=udata_readInt32(ds, inHeader->byteSize);
    } else if(
        ((length-headerSize)<(8*4) ||
         (uint32_t)(length-headerSize)<(header.byteSize=udata_readInt32(ds, inHeader->byteSize)))
    ) {
        udata_printError(ds, "ucol_swapInverseUCA(): too few bytes (%d after header) for inverse UCA collation data\n",
                         length);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    if(length>=0) {
        /* copy everything, takes care of data that needs no swapping */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, header.byteSize);
        }

        /* swap the necessary pieces in the order of their occurrence in the data */

        /* read more of the InverseUCATableHeader (the byteSize field was read above) */
        header.tableSize=   ds->readUInt32(inHeader->tableSize);
        header.contsSize=   ds->readUInt32(inHeader->contsSize);
        header.table=       ds->readUInt32(inHeader->table);
        header.conts=       ds->readUInt32(inHeader->conts);

        /* swap the 32-bit integers in the header */
        ds->swapArray32(ds, inHeader, 5*4, outHeader, pErrorCode);

        /* swap the inverse table; tableSize counts uint32_t[3] rows */
        ds->swapArray32(ds, inBytes+header.table, header.tableSize*3*4,
                           outBytes+header.table, pErrorCode);

        /* swap the continuation table; contsSize counts UChars */
        ds->swapArray16(ds, inBytes+header.conts, header.contsSize*U_SIZEOF_UCHAR,
                           outBytes+header.conts, pErrorCode);
    }

    return headerSize+header.byteSize;
}